

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall BuildWithLogTestRestatMissingFile::Run(BuildWithLogTestRestatMissingFile *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  size_type sVar6;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  undefined4 local_118;
  allocator<char> local_111;
  string local_110;
  undefined1 local_f0 [8];
  string err;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ManifestParserOptions local_1c;
  int local_14;
  BuildWithLogTestRestatMissingFile *pBStack_10;
  int fail_count;
  BuildWithLogTestRestatMissingFile *this_local;
  
  pBStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions(&local_1c);
  AssertParse(&(this->super_BuildWithLogTest).super_BuildTest.super_StateTestWithBuiltinRules.state_
              ,
              "rule true\n  command = true\n  restat = 1\nrule cc\n  command = cc\nbuild out1: true in\nbuild out2: cc out1\n"
              ,local_1c);
  iVar2 = local_14;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar2 == iVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"in",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
    VirtualFileSystem::Create
              (&(this->super_BuildWithLogTest).super_BuildTest.fs_,&local_40,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"out2",&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"",(allocator<char> *)(err.field_2._M_local_buf + 0xf));
    VirtualFileSystem::Create
              (&(this->super_BuildWithLogTest).super_BuildTest.fs_,&local_a0,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    std::__cxx11::string::string((string *)local_f0);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"out2",&local_111);
    pNVar5 = Builder::AddTarget(&(this->super_BuildWithLogTest).super_BuildTest.builder_,&local_110,
                                (string *)local_f0);
    testing::Test::Check
              (pTVar1,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x5b6,"builder_.AddTarget(\"out2\", &err)");
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    pTVar1 = g_current_test;
    bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_f0);
    bVar3 = testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x5b7,"\"\" == err");
    pTVar1 = g_current_test;
    if (bVar3) {
      bVar3 = Builder::Build(&(this->super_BuildWithLogTest).super_BuildTest.builder_,
                             (string *)local_f0);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x5b8,"builder_.Build(&err)");
      pTVar1 = g_current_test;
      bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_f0);
      bVar3 = testing::Test::Check
                        (pTVar1,bVar3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x5b9,"\"\" == err");
      if (bVar3) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&(this->super_BuildWithLogTest).super_BuildTest.command_runner_.commands_ran_);
        State::Reset(&(this->super_BuildWithLogTest).super_BuildTest.super_StateTestWithBuiltinRules
                      .state_);
        VirtualFileSystem::Tick(&(this->super_BuildWithLogTest).super_BuildTest.fs_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"in",&local_139);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"",&local_161);
        VirtualFileSystem::Create
                  (&(this->super_BuildWithLogTest).super_BuildTest.fs_,&local_138,&local_160);
        std::__cxx11::string::~string((string *)&local_160);
        std::allocator<char>::~allocator(&local_161);
        std::__cxx11::string::~string((string *)&local_138);
        std::allocator<char>::~allocator(&local_139);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"out2",&local_189);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"",&local_1b1);
        VirtualFileSystem::Create
                  (&(this->super_BuildWithLogTest).super_BuildTest.fs_,&local_188,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::allocator<char>::~allocator(&local_1b1);
        std::__cxx11::string::~string((string *)&local_188);
        std::allocator<char>::~allocator(&local_189);
        pTVar1 = g_current_test;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"out2",&local_1d9);
        pNVar5 = Builder::AddTarget(&(this->super_BuildWithLogTest).super_BuildTest.builder_,
                                    &local_1d8,(string *)local_f0);
        testing::Test::Check
                  (pTVar1,pNVar5 != (Node *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                   ,0x5c4,"builder_.AddTarget(\"out2\", &err)");
        std::__cxx11::string::~string((string *)&local_1d8);
        std::allocator<char>::~allocator(&local_1d9);
        pTVar1 = g_current_test;
        bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_f0);
        bVar3 = testing::Test::Check
                          (pTVar1,bVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x5c5,"\"\" == err");
        pTVar1 = g_current_test;
        if (bVar3) {
          bVar3 = Builder::Build(&(this->super_BuildWithLogTest).super_BuildTest.builder_,
                                 (string *)local_f0);
          testing::Test::Check
                    (pTVar1,bVar3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                     ,0x5c6,"builder_.Build(&err)");
          pTVar1 = g_current_test;
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&(this->super_BuildWithLogTest).super_BuildTest.command_runner_.
                          commands_ran_);
          bVar3 = testing::Test::Check
                            (pTVar1,sVar6 == 1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                             ,0x5c7,"1u == command_runner_.commands_ran_.size()");
          if (bVar3) {
            local_118 = 0;
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            local_118 = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          local_118 = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        local_118 = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      local_118 = 1;
    }
    std::__cxx11::string::~string((string *)local_f0);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(BuildWithLogTest, RestatMissingFile) {
  // If a restat rule doesn't create its output, and the output didn't
  // exist before the rule was run, consider that behavior equivalent
  // to a rule that doesn't modify its existent output file.

  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule true\n"
"  command = true\n"
"  restat = 1\n"
"rule cc\n"
"  command = cc\n"
"build out1: true in\n"
"build out2: cc out1\n"));

  fs_.Create("in", "");
  fs_.Create("out2", "");

  // Do a pre-build so that there's commands in the log for the outputs,
  // otherwise, the lack of an entry in the build log will cause out2 to rebuild
  // regardless of restat.
  string err;
  EXPECT_TRUE(builder_.AddTarget("out2", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ("", err);
  command_runner_.commands_ran_.clear();
  state_.Reset();

  fs_.Tick();
  fs_.Create("in", "");
  fs_.Create("out2", "");

  // Run a build, expect only the first command to run.
  // It doesn't touch its output (due to being the "true" command), so
  // we shouldn't run the dependent build.
  EXPECT_TRUE(builder_.AddTarget("out2", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());
}